

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O3

int sfp_get_vendor_name(tcv_t *tcv,char *vendor_name)

{
  undefined8 uVar1;
  int iVar2;
  
  iVar2 = -4;
  if ((vendor_name != (char *)0x0 && tcv != (tcv_t *)0x0) && (tcv->data != (void *)0x0)) {
    vendor_name[0x10] = '\0';
    uVar1 = *(undefined8 *)((long)tcv->data + 0x1d);
    *(undefined8 *)vendor_name = *(undefined8 *)((long)tcv->data + 0x15);
    *(undefined8 *)(vendor_name + 8) = uVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int sfp_get_vendor_name(tcv_t *tcv, char vendor_name[BASIC_INFO_REG_VENDOR_NAME_SIZE + 1])
{
	if (tcv == NULL || vendor_name == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Indicates end of string */
	vendor_name[BASIC_INFO_REG_VENDOR_NAME_SIZE] = '\0';

	memcpy(vendor_name, &((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_VENDOR_NAME], BASIC_INFO_REG_VENDOR_NAME_SIZE);

	return 0;
}